

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O1

bool __thiscall
draco::ObjDecoder::ParseMaterialFile(ObjDecoder *this,string *file_name,Status *status)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  Status *pSVar4;
  vector<char,_std::allocator<char>_> buffer;
  string full_path;
  DecoderBuffer old_buffer;
  vector<char,_std::allocator<char>_> local_98;
  string local_78;
  char *local_58;
  int64_t iStack_50;
  int64_t local_48;
  BitDecoder BStack_40;
  undefined8 local_28;
  
  GetFullPath(&local_78,file_name,&this->input_file_name_);
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar2 = ReadFileToBuffer(&local_78,&local_98);
  if (bVar2) {
    local_28._0_1_ = (this->buffer_).bit_mode_;
    local_28._1_1_ = (this->buffer_).field_0x31;
    local_28._2_2_ = (this->buffer_).bitstream_version_;
    local_28._4_4_ = *(undefined4 *)&(this->buffer_).field_0x34;
    local_58 = (this->buffer_).data_;
    iStack_50 = (this->buffer_).data_size_;
    local_48 = (this->buffer_).pos_;
    BStack_40.bit_buffer_ = (this->buffer_).bit_decoder_.bit_buffer_;
    BStack_40.bit_buffer_end_ = (this->buffer_).bit_decoder_.bit_buffer_end_;
    BStack_40.bit_offset_ = (this->buffer_).bit_decoder_.bit_offset_;
    pSVar4 = (Status *)
             local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    DecoderBuffer::Init(&this->buffer_,
                        local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
    this->num_materials_ = 0;
    do {
      bVar3 = ParseMaterialFileDefinition(this,pSVar4);
      uVar1 = local_28;
    } while (bVar3);
    (this->buffer_).bit_mode_ = (bool)(undefined1)local_28;
    (this->buffer_).field_0x31 = local_28._1_1_;
    (this->buffer_).bitstream_version_ = local_28._2_2_;
    (this->buffer_).bit_decoder_.bit_buffer_end_ = BStack_40.bit_buffer_end_;
    (this->buffer_).bit_decoder_.bit_offset_ = BStack_40.bit_offset_;
    (this->buffer_).pos_ = local_48;
    (this->buffer_).bit_decoder_.bit_buffer_ = BStack_40.bit_buffer_;
    (this->buffer_).data_ = local_58;
    (this->buffer_).data_size_ = iStack_50;
    local_28 = uVar1;
    DecoderBuffer::BitDecoder::~BitDecoder(&BStack_40);
  }
  if ((Status *)
      local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (Status *)0x0) {
    operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool ObjDecoder::ParseMaterialFile(const std::string &file_name,
                                   Status *status) {
  const std::string full_path = GetFullPath(file_name, input_file_name_);
  std::vector<char> buffer;
  if (!ReadFileToBuffer(full_path, &buffer)) {
    return false;
  }

  // Backup the original decoder buffer.
  DecoderBuffer old_buffer = buffer_;

  buffer_.Init(buffer.data(), buffer.size());

  num_materials_ = 0;
  while (ParseMaterialFileDefinition(status)) {
  }

  // Restore the original buffer.
  buffer_ = old_buffer;
  return true;
}